

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibPrint(Sfm_Lib_t *p)

{
  word *pwVar1;
  word *pwVar2;
  ulong *puVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  word *pTruth;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  word *pwVar15;
  word *pwVar16;
  uint i;
  
  i = 0;
  do {
    if ((p->vTtMem->nEntries <= (int)i) ||
       (pTruth = Vec_MemReadEntry(p->vTtMem,i), pTruth == (word *)0x0)) {
      return;
    }
    if ((1 < i) && (iVar5 = Vec_IntEntry(&p->vHits,i), iVar5 != 0)) {
      uVar9 = p->nVars;
      bVar4 = (char)uVar9 - 6U & 0x1f;
      uVar6 = 1 << bVar4;
      uVar7 = 0 << bVar4;
      uVar10 = (ulong)uVar7;
      uVar8 = uVar6;
      if ((int)uVar6 < 1) {
        uVar8 = uVar7;
      }
      uVar12 = 0;
      if (0 < (int)uVar9) {
        uVar12 = (ulong)uVar9;
      }
      iVar5 = 0;
      for (; uVar10 != uVar12; uVar10 = uVar10 + 1) {
        bVar4 = (byte)uVar10;
        if ((int)uVar9 < 7) {
          if ((s_Truths6Neg[uVar10] & (*pTruth >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *pTruth))
              != 0) {
LAB_00409b4a:
            iVar5 = iVar5 + 1;
          }
        }
        else {
          if (uVar10 < 6) {
            uVar14 = 0;
            do {
              if (uVar8 == uVar14) goto LAB_00409b4d;
              puVar3 = pTruth + uVar14;
              uVar14 = uVar14 + 1;
            } while ((s_Truths6Neg[uVar10] &
                     (*puVar3 >> ((byte)(1 << (bVar4 & 0x1f)) & 0x3f) ^ *puVar3)) == 0);
            goto LAB_00409b4a;
          }
          uVar7 = 1 << (bVar4 - 6 & 0x1f);
          iVar13 = 2 << (bVar4 - 6 & 0x1f);
          uVar14 = 0;
          if (0 < (int)uVar7) {
            uVar14 = (ulong)uVar7;
          }
          pwVar15 = pTruth + (int)uVar7;
          for (pwVar16 = pTruth; pwVar16 < pTruth + (int)uVar6; pwVar16 = pwVar16 + iVar13) {
            uVar11 = 0;
            while (uVar14 != uVar11) {
              pwVar1 = pwVar16 + uVar11;
              pwVar2 = pwVar15 + uVar11;
              uVar11 = uVar11 + 1;
              if (*pwVar1 != *pwVar2) goto LAB_00409b4a;
            }
            pwVar15 = pwVar15 + iVar13;
          }
        }
LAB_00409b4d:
      }
      printf("%8d : ",(ulong)i);
      uVar9 = Vec_IntEntry(&p->vCounts,i);
      printf("Num =%5d  ",(ulong)uVar9);
      uVar9 = Vec_IntEntry(&p->vHits,i);
      printf("Hit =%4d  ",(ulong)uVar9);
      iVar13 = Vec_IntEntry(&p->vLists,i);
      if ((iVar13 != -1) && (p->pObjs != (Sfm_Fun_t *)0x0)) {
        Sfm_LibPrintObj(p,p->pObjs + iVar13);
      }
      printf("    ");
      Dau_DsdPrintFromTruth(pTruth,iVar5);
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Sfm_LibPrint( Sfm_Lib_t * p )
{
    Sfm_Fun_t * pObj; word * pTruth; int i, nFanins;   
    Vec_MemForEachEntry( p->vTtMem, pTruth, i )
    {
        if ( i < 2 || Vec_IntEntry(&p->vHits, i) == 0 )
            continue;
        nFanins = Abc_TtSupportSize(pTruth, p->nVars);
        printf( "%8d : ", i );
        printf( "Num =%5d  ", Vec_IntEntry(&p->vCounts, i) );
        printf( "Hit =%4d  ", Vec_IntEntry(&p->vHits, i) );
        Sfm_LibForEachSuper( p, pObj, i )
        {
            Sfm_LibPrintObj( p, pObj );
            break;
        }
        printf( "    " );
        Dau_DsdPrintFromTruth( pTruth, nFanins );
    }
}